

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

string * __thiscall
slang::CommandLine::findNearestMatch_abi_cxx11_
          (string *__return_storage_ptr__,CommandLine *this,string_view arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  int iVar4;
  void *pvVar5;
  _Rb_tree_node_base *p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ulong uVar8;
  size_t __n_00;
  size_type __n;
  ulong uVar9;
  undefined8 uVar10;
  _Rb_tree_header *p_Var11;
  _Base_ptr p_Var12;
  string *psVar13;
  int maxDistance;
  string_view right;
  string_view left;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  long local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  
  right._M_str = arg._M_str;
  __n_00 = arg._M_len;
  if (2 < __n_00) {
    local_38 = __return_storage_ptr__;
    pvVar5 = memchr(right._M_str,0x3d,__n_00);
    uVar8 = (long)pvVar5 - (long)right._M_str;
    uVar9 = uVar8;
    if (__n_00 < uVar8) {
      uVar9 = __n_00;
    }
    if (uVar8 == 0xffffffffffffffff) {
      uVar9 = __n_00;
    }
    if (pvVar5 == (void *)0x0) {
      uVar9 = __n_00;
    }
    p_Var6 = (this->optionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var11 = &(this->optionMap)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 == p_Var11) {
      local_60 = 0;
      p_Var12 = (_Base_ptr)0x0;
    }
    else {
      maxDistance = 5;
      p_Var12 = (_Base_ptr)0x0;
      local_60 = 0;
      do {
        if ((**(char **)(p_Var6 + 1) != '+') &&
           (right._M_len = uVar9, left._M_str = *(char **)(p_Var6 + 1),
           left._M_len = (size_t)p_Var6[1]._M_parent,
           iVar4 = editDistance(left,right,true,maxDistance), iVar4 < maxDistance)) {
          local_60 = *(long *)(p_Var6 + 1);
          p_Var12 = p_Var6[1]._M_parent;
          maxDistance = iVar4;
        }
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var11);
    }
    __return_storage_ptr__ = local_38;
    if (p_Var12 != (_Base_ptr)0x0) {
      paVar2 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar2;
      if (p_Var12 == (_Base_ptr)0x1) {
        local_58.field_2._M_allocated_capacity._0_2_ = 0x2d;
        local_58._M_string_length = 1;
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,local_60,local_60 + 1);
        psVar13 = local_38;
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar2) {
          uVar9 = CONCAT53(local_58.field_2._M_allocated_capacity._3_5_,
                           CONCAT12(local_58.field_2._M_local_buf[2],
                                    local_58.field_2._M_allocated_capacity._0_2_));
        }
        if (uVar9 < local_80._M_string_length + local_58._M_string_length) {
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            uVar10 = local_80.field_2._M_allocated_capacity;
          }
          if (local_80._M_string_length + local_58._M_string_length <= (ulong)uVar10) {
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::replace(&local_80,0,0,local_58._M_dataplus._M_p,local_58._M_string_length);
            goto LAB_001e437a;
          }
        }
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_58,local_80._M_dataplus._M_p,local_80._M_string_length);
      }
      else {
        local_58.field_2._M_allocated_capacity._0_2_ = 0x2d2d;
        local_58._M_string_length = 2;
        local_58.field_2._M_local_buf[2] = '\0';
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,local_60,(long)&p_Var12->_M_color + local_60);
        psVar13 = local_38;
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar2) {
          uVar9 = CONCAT53(local_58.field_2._M_allocated_capacity._3_5_,
                           CONCAT12(local_58.field_2._M_local_buf[2],
                                    local_58.field_2._M_allocated_capacity._0_2_));
        }
        if (uVar9 < local_80._M_string_length + local_58._M_string_length) {
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            uVar10 = local_80.field_2._M_allocated_capacity;
          }
          if (local_80._M_string_length + local_58._M_string_length <= (ulong)uVar10) {
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::replace(&local_80,0,0,local_58._M_dataplus._M_p,local_58._M_string_length);
            goto LAB_001e437a;
          }
        }
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_58,local_80._M_dataplus._M_p,local_80._M_string_length);
      }
LAB_001e437a:
      (psVar13->_M_dataplus)._M_p = (pointer)&psVar13->field_2;
      pcVar3 = (pbVar7->_M_dataplus)._M_p;
      paVar1 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 == paVar1) {
        uVar10 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        (psVar13->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
        *(undefined8 *)((long)&psVar13->field_2 + 8) = uVar10;
      }
      else {
        (psVar13->_M_dataplus)._M_p = pcVar3;
        (psVar13->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      psVar13->_M_string_length = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar1;
      pbVar7->_M_string_length = 0;
      paVar1->_M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == paVar2) {
        return psVar13;
      }
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT53(local_58.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_58.field_2._M_local_buf[2],
                                        local_58.field_2._M_allocated_capacity._0_2_)) + 1);
      return psVar13;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::findNearestMatch(std::string_view arg) const {
    if (arg.length() <= 2)
        return {};

    size_t equalsIndex = arg.find_first_of('=');
    if (equalsIndex != std::string_view::npos)
        arg = arg.substr(0, equalsIndex);

    std::string_view bestName;
    int bestDistance = 5;

    for (auto& [key, value] : optionMap) {
        if (key[0] == '+')
            continue;

        int dist = editDistance(key, arg, /* allowReplacements */ true, bestDistance);
        if (dist < bestDistance) {
            bestName = key;
            bestDistance = dist;
        }
    }

    if (bestName.empty())
        return {};

    if (bestName.length() == 1)
        return "-"s + std::string(bestName);

    return "--"s + std::string(bestName);
}